

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void __thiscall ImBitArray<132,_0>::SetBitRange(ImBitArray<132,_0> *this,int n,int n2)

{
  sbyte sVar1;
  
  if ((((uint)n < 0x84) && (n < n2)) && (n2 < 0x85)) {
    do {
      sVar1 = ((byte)(n2 + -1) & 0x1f) + 1;
      if ((int)(n | 0x1fU) < n2 + -1) {
        sVar1 = 0x20;
      }
      this->Storage[n >> 5] =
           this->Storage[n >> 5] | (~(uint)(-1L << sVar1) >> ((byte)n & 0x1f)) << ((byte)n & 0x1f);
      n = (n & 0xffffffe0U) + 0x20;
    } while (n < n2);
    return;
  }
  __assert_fail("n >= 0 && n < BITCOUNT && n2 > n && n2 <= BITCOUNT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_internal.h"
                ,0x236,"void ImBitArray<132>::SetBitRange(int, int) [BITCOUNT = 132, OFFSET = 0]");
}

Assistant:

void            SetBitRange(int n, int n2)  { n += OFFSET; n2 += OFFSET; IM_ASSERT(n >= 0 && n < BITCOUNT && n2 > n && n2 <= BITCOUNT); ImBitArraySetBitRange(Storage, n, n2); }